

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Server_run_shutdown(UA_Server *server)

{
  ulong uVar1;
  ulong local_38;
  size_t j;
  size_t stopJobsSize;
  UA_Job *stopJobs;
  UA_ServerNetworkLayer *nl;
  size_t i;
  UA_Server *server_local;
  
  i = (size_t)server;
  for (nl = (UA_ServerNetworkLayer *)0x0; nl < *(UA_ServerNetworkLayer **)(i + 0x168);
      nl = (UA_ServerNetworkLayer *)((long)&nl->handle + 1)) {
    stopJobs = (UA_Job *)(*(long *)(i + 0x170) + (long)nl * 0x38);
    stopJobsSize = 0;
    uVar1 = (**(code **)&stopJobs[1].job)(stopJobs,&stopJobsSize);
    for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
      processJob((UA_Server *)i,(UA_Job *)(stopJobsSize + local_38 * 0x20));
    }
    free((void *)stopJobsSize);
  }
  processDelayedCallbacks((UA_Server *)i);
  return 0;
}

Assistant:

UA_StatusCode UA_Server_run_shutdown(UA_Server *server) {
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_Job *stopJobs = NULL;
        size_t stopJobsSize = nl->stop(nl, &stopJobs);
        for(size_t j = 0; j < stopJobsSize; ++j)
            processJob(server, &stopJobs[j]);
        UA_free(stopJobs);
    }

#ifdef UA_ENABLE_MULTITHREADING
    /* Ensure that run_shutdown can be called multiple times */
    if(server->workers) {
        UA_LOG_INFO(server->config.logger, UA_LOGCATEGORY_SERVER,
                    "Shutting down %u worker thread(s)", server->config.nThreads);
        /* Wait for all worker threads to finish */
        for(size_t i = 0; i < server->config.nThreads; ++i)
            server->workers[i].running = false;
        pthread_cond_broadcast(&server->dispatchQueue_condition);
        for(size_t i = 0; i < server->config.nThreads; ++i)
            pthread_join(server->workers[i].thr, NULL);
        /* Free the worker structures */
        UA_free(server->workers);
        server->workers = NULL;
    }

    /* Manually finish the work still enqueued */
    emptyDispatchQueue(server);
    UA_ASSERT_RCU_UNLOCKED();
    rcu_barrier(); // wait for all scheduled call_rcu work to complete
#else
    processDelayedCallbacks(server);
#endif
    return UA_STATUSCODE_GOOD;
}